

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crab-combat.cpp
# Opt level: O0

decks_t * play<void(*)(std::deque<unsigned_long,std::allocator<unsigned_long>>&,std::deque<unsigned_long,std::allocator<unsigned_long>>&)>
                    (decks_t *__return_storage_ptr__,decks_t *decks,size_t p1,size_t p2,
                    _func_void_deque<unsigned_long,_std::allocator<unsigned_long>_>_ptr_deque<unsigned_long,_std::allocator<unsigned_long>_>_ptr
                    *strategy)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  cards_t *p2d;
  cards_t *p1d;
  _func_void_deque<unsigned_long,_std::allocator<unsigned_long>_>_ptr_deque<unsigned_long,_std::allocator<unsigned_long>_>_ptr
  *strategy_local;
  size_t p2_local;
  size_t p1_local;
  decks_t *decks_local;
  
  strategy_local =
       (_func_void_deque<unsigned_long,_std::allocator<unsigned_long>_>_ptr_deque<unsigned_long,_std::allocator<unsigned_long>_>_ptr
        *)p2;
  p2_local = p1;
  p1_local = (size_t)decks;
  decks_local = __return_storage_ptr__;
  pmVar1 = std::
           unordered_map<unsigned_long,_deck_t,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>_>
           ::at(decks,&p2_local);
  pmVar2 = std::
           unordered_map<unsigned_long,_deck_t,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>_>
           ::at(decks,(key_type *)&strategy_local);
  (*strategy)(&pmVar1->cards,&pmVar2->cards);
  std::
  unordered_map<unsigned_long,_deck_t,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>_>
  ::unordered_map(__return_storage_ptr__,decks);
  return __return_storage_ptr__;
}

Assistant:

auto play(decks_t decks, size_t p1, size_t p2, T strategy) {
  auto& p1d = decks.at(p1).cards;
  auto& p2d = decks.at(p2).cards;
  strategy(p1d, p2d);
  return decks;
}